

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O0

uint64_t mse_4xh_16bit_highbd_avx2(uint16_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  uint in_ECX;
  ulong in_RDX;
  ulong uVar21;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i v;
  __m128i sum_1x64;
  __m128i sum_2x64;
  int i;
  __m256i square_result;
  __m256i zeros;
  __m256i sub_result;
  __m256i res3_4x64;
  __m256i res2_4x64;
  __m256i res1_4x64;
  __m256i res0_4x64;
  __m256i dst_16x16;
  __m256i dst1_8x16;
  __m256i dst0_8x16;
  __m256i src_16x16;
  __m256i src1_8x16;
  __m256i src0_8x16;
  __m128i reg3_4x16;
  __m128i reg2_4x16;
  __m128i reg1_4x16;
  __m128i reg0_4x16;
  uint64_t sum;
  int local_824;
  undefined1 local_820 [24];
  undefined8 uStack_808;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  uint64_t local_628 [3];
  int local_60c;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong *local_308;
  ulong local_300;
  undefined8 uStack_2f8;
  ulong *local_2e8;
  ulong local_2e0;
  undefined8 uStack_2d8;
  ulong *local_2c8;
  ulong local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  ulong *local_288;
  ulong local_280;
  undefined8 uStack_278;
  ulong *local_268;
  ulong local_260;
  undefined8 uStack_258;
  ulong *local_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong *local_228;
  ulong local_220;
  undefined8 uStack_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong local_200;
  undefined8 uStack_1f8;
  ulong local_1f0;
  undefined8 uStack_1e8;
  ulong local_1e0;
  undefined8 uStack_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar20 = uStack_338;
  uVar19 = local_340;
  local_60c = (int)in_RSI;
  local_628[0] = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_360 = 0;
  uStack_358 = 0;
  _local_820 = ZEXT1632(ZEXT816(0));
  local_824 = 0;
  uVar21 = in_RDX;
  while( true ) {
    auVar11 = stack0xfffffffffffff7f0;
    if (in_R8D <= local_824) break;
    local_228 = (ulong *)(in_RDI + (long)(local_824 * local_60c) * 2);
    local_240 = *local_228;
    uStack_238 = 0;
    local_248 = (ulong *)(in_RDI + (long)((local_824 + 1) * local_60c) * 2);
    local_260 = *local_248;
    uStack_258 = 0;
    local_268 = (ulong *)(in_RDI + (long)((local_824 + 2) * local_60c) * 2);
    local_280 = *local_268;
    uStack_278 = 0;
    local_288 = (ulong *)(in_RDI + (long)((local_824 + 3) * local_60c) * 2);
    local_2a0 = *local_288;
    uStack_298 = 0;
    uStack_1a8 = 0;
    uStack_1b8 = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_240;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_260;
    local_3f0 = vpunpcklqdq_avx(auVar18,auVar17);
    uStack_1c8 = 0;
    uStack_1d8 = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_280;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_2a0;
    local_400 = vpunpcklqdq_avx(auVar16,auVar15);
    auVar4._16_8_ = local_260;
    auVar4._0_16_ = local_3f0;
    auVar4._24_8_ = 0;
    auVar3._16_8_ = local_260;
    auVar3._0_16_ = local_400;
    auVar3._24_8_ = 0;
    auVar3 = vperm2i128_avx2(auVar4,auVar3,0x20);
    local_2a8 = (ulong *)(in_RDX + (long)(int)(local_824 * in_ECX) * 2);
    local_2c0 = *local_2a8;
    uStack_2b8 = 0;
    local_2c8 = (ulong *)(in_RDX + (long)(int)((local_824 + 1) * in_ECX) * 2);
    local_2e0 = *local_2c8;
    uStack_2d8 = 0;
    local_2e8 = (ulong *)(in_RDX + (long)(int)((local_824 + 2) * in_ECX) * 2);
    local_300 = *local_2e8;
    uStack_2f8 = 0;
    uVar21 = (ulong)in_ECX;
    local_308 = (ulong *)(in_RDX + (long)(int)((local_824 + 3) * in_ECX) * 2);
    local_320 = *local_308;
    uStack_318 = 0;
    uStack_1e8 = 0;
    uStack_1f8 = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_2c0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_2e0;
    local_410 = vpunpcklqdq_avx(auVar14,auVar13);
    uStack_208 = 0;
    uStack_218 = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_300;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_320;
    local_420 = vpunpcklqdq_avx(auVar12,auVar11);
    auVar2._16_8_ = local_260;
    auVar2._0_16_ = local_410;
    auVar2._24_8_ = 0;
    auVar1._16_8_ = local_260;
    auVar1._0_16_ = local_420;
    auVar1._24_8_ = 0;
    auVar4 = vperm2i128_avx2(auVar2,auVar1,0x20);
    local_6e0 = auVar4._0_8_;
    local_5e0 = local_6e0;
    uStack_6d8 = auVar4._8_8_;
    uStack_5d8 = uStack_6d8;
    uStack_6d0 = auVar4._16_8_;
    uStack_5d0 = uStack_6d0;
    uStack_6c8 = auVar4._24_8_;
    uStack_5c8 = uStack_6c8;
    local_740 = auVar3._0_8_;
    local_600 = local_740;
    uStack_738 = auVar3._8_8_;
    uStack_5f8 = uStack_738;
    uStack_730 = auVar3._16_8_;
    uStack_5f0 = uStack_730;
    uStack_728 = auVar3._24_8_;
    uStack_5e8 = uStack_728;
    local_1a0 = vpsubw_avx2(auVar4,auVar3);
    auVar3 = vpabsw_avx2(local_1a0);
    local_7e0 = auVar3._0_8_;
    local_3c0 = local_7e0;
    uStack_7d8 = auVar3._8_8_;
    uStack_3b8 = uStack_7d8;
    uStack_7d0 = auVar3._16_8_;
    uStack_3b0 = uStack_7d0;
    uStack_7c8 = auVar3._24_8_;
    uStack_3a8 = uStack_7c8;
    auVar9._8_8_ = uVar20;
    auVar9._0_8_ = uVar19;
    auVar9._16_8_ = uVar19;
    auVar9._24_8_ = uVar20;
    auVar1 = vpunpcklwd_avx2(auVar3,auVar9);
    local_380 = local_7e0;
    uStack_378 = uStack_7d8;
    uStack_370 = uStack_7d0;
    uStack_368 = uStack_7c8;
    auVar10._8_8_ = uVar20;
    auVar10._0_8_ = uVar19;
    auVar10._16_8_ = uVar19;
    auVar10._24_8_ = uVar20;
    auVar4 = vpunpckhwd_avx2(auVar3,auVar10);
    local_6e0 = auVar1._0_8_;
    local_580 = local_6e0;
    uStack_6d8 = auVar1._8_8_;
    uStack_578 = uStack_6d8;
    uStack_6d0 = auVar1._16_8_;
    uStack_570 = uStack_6d0;
    uStack_6c8 = auVar1._24_8_;
    uStack_568 = uStack_6c8;
    auVar3 = vpmaddwd_avx2(auVar1,auVar1);
    local_740 = auVar4._0_8_;
    local_5c0 = local_740;
    uStack_738 = auVar4._8_8_;
    uStack_5b8 = uStack_738;
    uStack_730 = auVar4._16_8_;
    uStack_5b0 = uStack_730;
    uStack_728 = auVar4._24_8_;
    uStack_5a8 = uStack_728;
    auVar4 = vpmaddwd_avx2(auVar4,auVar4);
    local_6e0 = auVar3._0_8_;
    local_4e0 = local_6e0;
    uStack_6d8 = auVar3._8_8_;
    uStack_4d8 = uStack_6d8;
    uStack_6d0 = auVar3._16_8_;
    uStack_4d0 = uStack_6d0;
    uStack_6c8 = auVar3._24_8_;
    uStack_4c8 = uStack_6c8;
    auVar6._8_8_ = uVar20;
    auVar6._0_8_ = uVar19;
    auVar6._16_8_ = uVar19;
    auVar6._24_8_ = uVar20;
    auVar1 = vpunpckldq_avx2(auVar3,auVar6);
    local_460 = local_6e0;
    uStack_458 = uStack_6d8;
    uStack_450 = uStack_6d0;
    uStack_448 = uStack_6c8;
    auVar8._8_8_ = uVar20;
    auVar8._0_8_ = uVar19;
    auVar8._16_8_ = uVar19;
    auVar8._24_8_ = uVar20;
    auVar3 = vpunpckhdq_avx2(auVar3,auVar8);
    local_740 = auVar4._0_8_;
    local_520 = local_740;
    uStack_738 = auVar4._8_8_;
    uStack_518 = uStack_738;
    uStack_730 = auVar4._16_8_;
    uStack_510 = uStack_730;
    uStack_728 = auVar4._24_8_;
    uStack_508 = uStack_728;
    auVar5._8_8_ = uVar20;
    auVar5._0_8_ = uVar19;
    auVar5._16_8_ = uVar19;
    auVar5._24_8_ = uVar20;
    auVar2 = vpunpckldq_avx2(auVar4,auVar5);
    local_4a0 = local_740;
    uStack_498 = uStack_738;
    uStack_490 = uStack_730;
    uStack_488 = uStack_728;
    auVar7._8_8_ = uVar20;
    auVar7._0_8_ = uVar19;
    auVar7._16_8_ = uVar19;
    auVar7._24_8_ = uVar20;
    auVar4 = vpunpckhdq_avx2(auVar4,auVar7);
    local_160 = local_820._0_8_;
    uStack_158 = local_820._8_8_;
    uStack_150 = local_820._16_8_;
    uStack_148 = uStack_808;
    local_760 = auVar1._0_8_;
    local_a0 = local_760;
    uStack_758 = auVar1._8_8_;
    uStack_98 = uStack_758;
    uStack_750 = auVar1._16_8_;
    uStack_90 = uStack_750;
    uStack_748 = auVar1._24_8_;
    uStack_88 = uStack_748;
    local_780 = auVar3._0_8_;
    local_c0 = local_780;
    uStack_778 = auVar3._8_8_;
    uStack_b8 = uStack_778;
    uStack_770 = auVar3._16_8_;
    uStack_b0 = uStack_770;
    uStack_768 = auVar3._24_8_;
    uStack_a8 = uStack_768;
    local_e0 = vpaddq_avx2(auVar1,auVar3);
    local_7a0 = auVar2._0_8_;
    local_100 = local_7a0;
    uStack_798 = auVar2._8_8_;
    uStack_f8 = uStack_798;
    uStack_790 = auVar2._16_8_;
    uStack_f0 = uStack_790;
    uStack_788 = auVar2._24_8_;
    uStack_e8 = uStack_788;
    local_120 = vpaddq_avx2(local_e0,auVar2);
    local_7c0 = auVar4._0_8_;
    local_140 = local_7c0;
    uStack_7b8 = auVar4._8_8_;
    uStack_138 = uStack_7b8;
    uStack_7b0 = auVar4._16_8_;
    uStack_130 = uStack_7b0;
    uStack_7a8 = auVar4._24_8_;
    uStack_128 = uStack_7a8;
    local_180 = vpaddq_avx2(local_120,auVar4);
    _local_820 = vpaddq_avx2(_local_820,local_180);
    local_824 = local_824 + 4;
    local_5a0 = local_5c0;
    uStack_598 = uStack_5b8;
    uStack_590 = uStack_5b0;
    uStack_588 = uStack_5a8;
    local_560 = local_580;
    uStack_558 = uStack_578;
    uStack_550 = uStack_570;
    uStack_548 = uStack_568;
    local_220 = local_320;
    local_210 = local_300;
    local_200 = local_2e0;
    local_1f0 = local_2c0;
    local_1e0 = local_2a0;
    local_1d0 = local_280;
    local_1c0 = local_260;
    local_1b0 = local_240;
  }
  local_440 = local_820._0_8_;
  uStack_438 = local_820._8_8_;
  uStack_430 = local_820._16_8_;
  uStack_428 = uStack_808;
  uStack_38 = uStack_808;
  local_40 = local_820._16_8_;
  local_60 = vpaddq_avx(auVar11,local_50);
  local_70 = vpsrldq_avx(local_60,8);
  vpaddq_avx(local_60,local_70);
  v[1] = uVar21;
  v[0] = in_RSI;
  xx_storel_64(local_628,v);
  return local_628[0];
}

Assistant:

static uint64_t mse_4xh_16bit_highbd_avx2(uint16_t *dst, int dstride,
                                          uint16_t *src, int sstride, int h) {
  uint64_t sum = 0;
  __m128i reg0_4x16, reg1_4x16, reg2_4x16, reg3_4x16;
  __m256i src0_8x16, src1_8x16, src_16x16;
  __m256i dst0_8x16, dst1_8x16, dst_16x16;
  __m256i res0_4x64, res1_4x64, res2_4x64, res3_4x64;
  __m256i sub_result;
  const __m256i zeros = _mm256_broadcastsi128_si256(_mm_setzero_si128());
  __m256i square_result = _mm256_broadcastsi128_si256(_mm_setzero_si128());
  for (int i = 0; i < h; i += 4) {
    reg0_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 0) * dstride]));
    reg1_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 1) * dstride]));
    reg2_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 2) * dstride]));
    reg3_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 3) * dstride]));
    dst0_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(reg0_4x16, reg1_4x16));
    dst1_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(reg2_4x16, reg3_4x16));
    dst_16x16 = _mm256_permute2x128_si256(dst0_8x16, dst1_8x16, 0x20);

    reg0_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 0) * sstride]));
    reg1_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 1) * sstride]));
    reg2_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 2) * sstride]));
    reg3_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 3) * sstride]));
    src0_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(reg0_4x16, reg1_4x16));
    src1_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(reg2_4x16, reg3_4x16));
    src_16x16 = _mm256_permute2x128_si256(src0_8x16, src1_8x16, 0x20);

    sub_result = _mm256_abs_epi16(_mm256_sub_epi16(src_16x16, dst_16x16));

    src_16x16 = _mm256_unpacklo_epi16(sub_result, zeros);
    dst_16x16 = _mm256_unpackhi_epi16(sub_result, zeros);

    src_16x16 = _mm256_madd_epi16(src_16x16, src_16x16);
    dst_16x16 = _mm256_madd_epi16(dst_16x16, dst_16x16);

    res0_4x64 = _mm256_unpacklo_epi32(src_16x16, zeros);
    res1_4x64 = _mm256_unpackhi_epi32(src_16x16, zeros);
    res2_4x64 = _mm256_unpacklo_epi32(dst_16x16, zeros);
    res3_4x64 = _mm256_unpackhi_epi32(dst_16x16, zeros);

    square_result = _mm256_add_epi64(
        square_result,
        _mm256_add_epi64(
            _mm256_add_epi64(_mm256_add_epi64(res0_4x64, res1_4x64), res2_4x64),
            res3_4x64));
  }
  const __m128i sum_2x64 =
      _mm_add_epi64(_mm256_castsi256_si128(square_result),
                    _mm256_extracti128_si256(square_result, 1));
  const __m128i sum_1x64 = _mm_add_epi64(sum_2x64, _mm_srli_si128(sum_2x64, 8));
  xx_storel_64(&sum, sum_1x64);
  return sum;
}